

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O3

TypeIDHelper NULLC::Typeid(NULLCRef r)

{
  int *piVar1;
  uint in_stack_00000008;
  undefined4 in_stack_0000000c;
  
  if (in_stack_00000008 < *(uint *)(linker + 0x20c)) {
    piVar1 = (int *)&stack0x00000008;
    if ((*(byte *)(*(long *)(linker + 0x200) + 0x15 + (ulong)in_stack_00000008 * 0x50) & 4) != 0) {
      piVar1 = (int *)CONCAT44(r.typeID,in_stack_0000000c);
    }
    return (TypeIDHelper)*piVar1;
  }
  __assert_fail("index < count",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x7f,
                "T &FastVector<ExternTypeInfo>::operator[](unsigned int) [T = ExternTypeInfo, zeroNewMemory = false, skipConstructor = false]"
               );
}

Assistant:

NULLC::TypeIDHelper NULLC::Typeid(NULLCRef r)
{
	TypeIDHelper help;

	if(linker->exTypes[r.typeID].typeFlags & ExternTypeInfo::TYPE_IS_EXTENDABLE)
		help.id = *(int*)r.ptr;
	else
		help.id = r.typeID;

	return help;
}